

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::CreateSimpleBlock(Cluster *this,longlong st,longlong sz)

{
  long idx_00;
  BlockEntry **ppBVar1;
  SimpleBlock *this_00;
  SimpleBlock *local_80;
  long status;
  SimpleBlock *p;
  BlockEntry **pEntry;
  BlockEntry **ppEntry;
  long idx;
  longlong sz_local;
  longlong st_local;
  Cluster *this_local;
  
  if (this->m_entries == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c7c,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  if (this->m_entries_size < 1) {
    __assert_fail("m_entries_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c7d,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  if (this->m_entries_count < 0) {
    __assert_fail("m_entries_count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c7e,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  if (this->m_entries_count < this->m_entries_size) {
    idx_00 = this->m_entries_count;
    ppBVar1 = this->m_entries + idx_00;
    this_00 = (SimpleBlock *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    local_80 = (SimpleBlock *)0x0;
    if (this_00 != (SimpleBlock *)0x0) {
      SimpleBlock::SimpleBlock(this_00,this,idx_00,st,sz);
      local_80 = this_00;
    }
    *ppBVar1 = &local_80->super_BlockEntry;
    if (*ppBVar1 == (BlockEntry *)0x0) {
      this_local = (Cluster *)0xffffffffffffffff;
    }
    else {
      this_local = (Cluster *)SimpleBlock::Parse((SimpleBlock *)*ppBVar1);
      if (this_local == (Cluster *)0x0) {
        this->m_entries_count = this->m_entries_count + 1;
        this_local = (Cluster *)0x0;
      }
      else {
        if (*ppBVar1 != (BlockEntry *)0x0) {
          (*(*ppBVar1)->_vptr_BlockEntry[1])();
        }
        *ppBVar1 = (BlockEntry *)0x0;
      }
    }
    return (long)this_local;
  }
  __assert_fail("m_entries_count < m_entries_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1c7f,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
}

Assistant:

long Cluster::CreateSimpleBlock(long long st, long long sz) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow) SimpleBlock(this, idx, st, sz);

  if (pEntry == NULL)
    return -1;  // generic error

  SimpleBlock* const p = static_cast<SimpleBlock*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}